

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool ssh2_bpp_check_unimplemented(BinaryPacketProtocol *bpp,PktIn *pktin)

{
  uint uVar1;
  PktOut *pPVar2;
  
  uVar1 = pktin->type;
  if (((int)uVar1 < 0x100) &&
     ((ssh2_bpp_check_unimplemented::valid_bitmap[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0)) {
    pPVar2 = (*bpp->vt->new_pktout)(3);
    BinarySink_put_uint32(pPVar2->binarysink_,pktin->sequence);
    pq_base_push(&(bpp->out_pq).pqb,&pPVar2->qnode);
    return true;
  }
  return false;
}

Assistant:

bool ssh2_bpp_check_unimplemented(BinaryPacketProtocol *bpp, PktIn *pktin)
{
    static const unsigned valid_bitmap[] = {
        SSH2_BITMAP_WORD(0),
        SSH2_BITMAP_WORD(1),
        SSH2_BITMAP_WORD(2),
        SSH2_BITMAP_WORD(3),
        SSH2_BITMAP_WORD(4),
        SSH2_BITMAP_WORD(5),
        SSH2_BITMAP_WORD(6),
        SSH2_BITMAP_WORD(7),
    };

    if (pktin->type < 0x100 &&
        !((valid_bitmap[pktin->type >> 5] >> (pktin->type & 0x1F)) & 1)) {
        PktOut *pkt = ssh_bpp_new_pktout(bpp, SSH2_MSG_UNIMPLEMENTED);
        put_uint32(pkt, pktin->sequence);
        pq_push(&bpp->out_pq, pkt);
        return true;
    }

    return false;
}